

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::InsertionSort<StringItem>
               (StringItem *list,uint32 length,CompareVarsInfo *cvInfo)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  void *pvVar2;
  JavascriptString *pJVar3;
  ulong uVar4;
  StringItem *addr;
  Type TVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  Type *addr_00;
  ulong uVar12;
  StringItem *local_58;
  void *pvStack_48;
  StringItem item;
  
  p_Var1 = cvInfo->compareType;
  pvStack_48 = (void *)0x0;
  item.Value.ptr = (void *)0x0;
  if (1 < length) {
    local_58 = list + 1;
    uVar8 = 1;
    do {
      pvVar2 = list[uVar8].Value.ptr;
      Memory::Recycler::WBSetBit((char *)&pvStack_48);
      pvStack_48 = pvVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&pvStack_48);
      pJVar3 = list[uVar8].StringValue.ptr;
      Memory::Recycler::WBSetBit((char *)&item);
      item.Value.ptr = pJVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&item);
      bVar6 = (*p_Var1)(cvInfo,&pvStack_48,list + (uVar8 - 1));
      uVar11 = uVar8 & 0xffffffff;
      if (bVar6) {
        uVar11 = 0;
      }
      uVar12 = (ulong)((int)uVar8 - 1);
      if (!bVar6) {
        uVar12 = uVar8 & 0xffffffff;
      }
      while( true ) {
        uVar10 = (uint)uVar11;
        uVar4 = uVar8;
        addr = local_58;
        pvVar2 = pvStack_48;
        if ((uint)uVar12 <= uVar10) break;
        uVar7 = (uint)uVar12 - uVar10 >> 1;
        uVar9 = uVar7 + uVar10;
        bVar6 = (*p_Var1)(cvInfo,&pvStack_48,list + uVar9);
        if (bVar6) {
          uVar12 = (ulong)uVar9;
        }
        else {
          uVar11 = (ulong)(uVar10 + uVar7 + 1);
        }
      }
      for (; pvStack_48 = pvVar2, uVar11 < uVar4; uVar4 = uVar4 - 1) {
        pvVar2 = addr[-1].Value.ptr;
        Memory::Recycler::WBSetBit((char *)addr);
        (addr->Value).ptr = pvVar2;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        pJVar3 = addr[-1].StringValue.ptr;
        Memory::Recycler::WBSetBit((char *)&addr->StringValue);
        (addr->StringValue).ptr = pJVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&addr->StringValue);
        addr = addr + -1;
        pvVar2 = pvStack_48;
      }
      Memory::Recycler::WBSetBit((char *)(list + uVar11));
      addr_00 = &list[uVar11].StringValue;
      list[uVar11].Value.ptr = pvVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(list + uVar11);
      TVar5 = item.Value;
      Memory::Recycler::WBSetBit((char *)addr_00);
      addr_00->ptr = (JavascriptString *)TVar5.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
      uVar8 = uVar8 + 1;
      local_58 = local_58 + 1;
    } while (uVar8 != length);
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }